

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_write_single_quoted_scalar
              (yaml_emitter_t *emitter,yaml_char_t *value,size_t length,int allow_breaks)

{
  yaml_char_t yVar1;
  yaml_char_t *pyVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  yaml_char_t *pyVar6;
  int local_5c;
  int local_58;
  int local_54;
  int breaks;
  int spaces;
  yaml_string_t string;
  int allow_breaks_local;
  size_t length_local;
  yaml_char_t *value_local;
  yaml_emitter_t *emitter_local;
  
  bVar3 = false;
  bVar4 = false;
  iVar5 = yaml_emitter_write_indicator(emitter,"\'",1,0,0);
  string.end = value;
  if (iVar5 == 0) {
    emitter_local._4_4_ = 0;
  }
  else {
    while (string.end != value + length) {
      if (*string.end == ' ') {
        if (((((allow_breaks == 0) || (bVar3)) || (emitter->column <= emitter->best_width)) ||
            ((string.end == value || (string.end == value + length + -1)))) ||
           (string.end[1] == ' ')) {
          if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
             (iVar5 = yaml_emitter_flush(emitter), iVar5 == 0)) {
            return 0;
          }
          if ((*string.end & 0x80) == 0) {
            yVar1 = *string.end;
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
            string.end = string.end + 1;
          }
          else if ((*string.end & 0xe0) == 0xc0) {
            pyVar6 = string.end + 1;
            yVar1 = *string.end;
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
            string.end = string.end + 2;
            yVar1 = *pyVar6;
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
          }
          else if ((*string.end & 0xf0) == 0xe0) {
            yVar1 = *string.end;
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
            pyVar6 = string.end + 2;
            yVar1 = string.end[1];
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
            string.end = string.end + 3;
            yVar1 = *pyVar6;
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
          }
          else if ((*string.end & 0xf8) == 0xf0) {
            yVar1 = *string.end;
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
            yVar1 = string.end[1];
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
            pyVar6 = string.end + 3;
            yVar1 = string.end[2];
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
            string.end = string.end + 4;
            yVar1 = *pyVar6;
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
          }
          emitter->column = emitter->column + 1;
        }
        else {
          iVar5 = yaml_emitter_write_indent(emitter);
          if (iVar5 == 0) {
            return 0;
          }
          if ((*string.end & 0x80) == 0) {
            local_54 = 1;
          }
          else {
            if ((*string.end & 0xe0) == 0xc0) {
              local_58 = 2;
            }
            else {
              if ((*string.end & 0xf0) == 0xe0) {
                local_5c = 3;
              }
              else {
                local_5c = 0;
                if ((*string.end & 0xf8) == 0xf0) {
                  local_5c = 4;
                }
              }
              local_58 = local_5c;
            }
            local_54 = local_58;
          }
          string.end = string.end + local_54;
        }
        bVar3 = true;
      }
      else if ((((*string.end == '\r') || (*string.end == '\n')) ||
               ((*string.end == 0xc2 && (string.end[1] == 0x85)))) ||
              ((((*string.end == 0xe2 && (string.end[1] == 0x80)) && (string.end[2] == 0xa8)) ||
               (((*string.end == 0xe2 && (string.end[1] == 0x80)) && (string.end[2] == 0xa9)))))) {
        if ((!bVar4) && (*string.end == '\n')) {
          if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
             (iVar5 = yaml_emitter_flush(emitter), iVar5 == 0)) {
            return 0;
          }
          if (emitter->line_break == YAML_CR_BREAK) {
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = '\r';
          }
          else if (emitter->line_break == YAML_LN_BREAK) {
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = '\n';
          }
          else if (emitter->line_break == YAML_CRLN_BREAK) {
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = '\r';
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = '\n';
          }
          emitter->column = 0;
          emitter->line = emitter->line + 1;
        }
        if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
           (iVar5 = yaml_emitter_flush(emitter), iVar5 == 0)) {
          return 0;
        }
        if (*string.end == '\n') {
          if (((emitter->buffer).pointer + 5 < (emitter->buffer).end) ||
             (iVar5 = yaml_emitter_flush(emitter), iVar5 != 0)) {
            if (emitter->line_break == YAML_CR_BREAK) {
              pyVar2 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar2 + 1;
              *pyVar2 = '\r';
            }
            else if (emitter->line_break == YAML_LN_BREAK) {
              pyVar2 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar2 + 1;
              *pyVar2 = '\n';
            }
            else if (emitter->line_break == YAML_CRLN_BREAK) {
              pyVar2 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar2 + 1;
              *pyVar2 = '\r';
              pyVar2 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar2 + 1;
              *pyVar2 = '\n';
            }
            emitter->column = 0;
            emitter->line = emitter->line + 1;
          }
          string.end = string.end + 1;
        }
        else {
          if ((*string.end & 0x80) == 0) {
            yVar1 = *string.end;
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
            string.end = string.end + 1;
          }
          else if ((*string.end & 0xe0) == 0xc0) {
            pyVar6 = string.end + 1;
            yVar1 = *string.end;
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
            string.end = string.end + 2;
            yVar1 = *pyVar6;
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
          }
          else if ((*string.end & 0xf0) == 0xe0) {
            yVar1 = *string.end;
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
            pyVar6 = string.end + 2;
            yVar1 = string.end[1];
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
            string.end = string.end + 3;
            yVar1 = *pyVar6;
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
          }
          else if ((*string.end & 0xf8) == 0xf0) {
            yVar1 = *string.end;
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
            yVar1 = string.end[1];
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
            pyVar6 = string.end + 3;
            yVar1 = string.end[2];
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
            string.end = string.end + 4;
            yVar1 = *pyVar6;
            pyVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pyVar2 + 1;
            *pyVar2 = yVar1;
          }
          emitter->column = 0;
          emitter->line = emitter->line + 1;
        }
        emitter->indention = 1;
        bVar4 = true;
      }
      else {
        if ((bVar4) && (iVar5 = yaml_emitter_write_indent(emitter), iVar5 == 0)) {
          return 0;
        }
        if (*string.end == '\'') {
          if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
             (iVar5 = yaml_emitter_flush(emitter), iVar5 == 0)) {
            return 0;
          }
          pyVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar2 + 1;
          *pyVar2 = '\'';
          emitter->column = emitter->column + 1;
        }
        if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
           (iVar5 = yaml_emitter_flush(emitter), iVar5 == 0)) {
          return 0;
        }
        if ((*string.end & 0x80) == 0) {
          yVar1 = *string.end;
          pyVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar2 + 1;
          *pyVar2 = yVar1;
          string.end = string.end + 1;
        }
        else if ((*string.end & 0xe0) == 0xc0) {
          pyVar6 = string.end + 1;
          yVar1 = *string.end;
          pyVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar2 + 1;
          *pyVar2 = yVar1;
          string.end = string.end + 2;
          yVar1 = *pyVar6;
          pyVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar2 + 1;
          *pyVar2 = yVar1;
        }
        else if ((*string.end & 0xf0) == 0xe0) {
          yVar1 = *string.end;
          pyVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar2 + 1;
          *pyVar2 = yVar1;
          pyVar6 = string.end + 2;
          yVar1 = string.end[1];
          pyVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar2 + 1;
          *pyVar2 = yVar1;
          string.end = string.end + 3;
          yVar1 = *pyVar6;
          pyVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar2 + 1;
          *pyVar2 = yVar1;
        }
        else if ((*string.end & 0xf8) == 0xf0) {
          yVar1 = *string.end;
          pyVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar2 + 1;
          *pyVar2 = yVar1;
          yVar1 = string.end[1];
          pyVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar2 + 1;
          *pyVar2 = yVar1;
          pyVar6 = string.end + 3;
          yVar1 = string.end[2];
          pyVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar2 + 1;
          *pyVar2 = yVar1;
          string.end = string.end + 4;
          yVar1 = *pyVar6;
          pyVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar2 + 1;
          *pyVar2 = yVar1;
        }
        emitter->column = emitter->column + 1;
        emitter->indention = 0;
        bVar3 = false;
        bVar4 = false;
      }
    }
    if ((bVar4) && (iVar5 = yaml_emitter_write_indent(emitter), iVar5 == 0)) {
      emitter_local._4_4_ = 0;
    }
    else {
      iVar5 = yaml_emitter_write_indicator(emitter,"\'",0,0,0);
      if (iVar5 == 0) {
        emitter_local._4_4_ = 0;
      }
      else {
        emitter->whitespace = 0;
        emitter->indention = 0;
        emitter_local._4_4_ = 1;
      }
    }
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_write_single_quoted_scalar(yaml_emitter_t *emitter,
        yaml_char_t *value, size_t length, int allow_breaks)
{
    yaml_string_t string;
    int spaces = 0;
    int breaks = 0;

    STRING_ASSIGN(string, value, length);

    if (!yaml_emitter_write_indicator(emitter, "'", 1, 0, 0))
        return 0;

    while (string.pointer != string.end)
    {
        if (IS_SPACE(string))
        {
            if (allow_breaks && !spaces
                    && emitter->column > emitter->best_width
                    && string.pointer != string.start
                    && string.pointer != string.end - 1
                    && !IS_SPACE_AT(string, 1)) {
                if (!yaml_emitter_write_indent(emitter)) return 0;
                MOVE(string);
            }
            else {
                if (!WRITE(emitter, string)) return 0;
            }
            spaces = 1;
        }
        else if (IS_BREAK(string))
        {
            if (!breaks && CHECK(string, '\n')) {
                if (!PUT_BREAK(emitter)) return 0;
            }
            if (!WRITE_BREAK(emitter, string)) return 0;
            emitter->indention = 1;
            breaks = 1;
        }
        else
        {
            if (breaks) {
                if (!yaml_emitter_write_indent(emitter)) return 0;
            }
            if (CHECK(string, '\'')) {
                if (!PUT(emitter, '\'')) return 0;
            }
            if (!WRITE(emitter, string)) return 0;
            emitter->indention = 0;
            spaces = 0;
            breaks = 0;
        }
    }

    if (breaks)
        if (!yaml_emitter_write_indent(emitter)) return 0;

    if (!yaml_emitter_write_indicator(emitter, "'", 0, 0, 0))
        return 0;

    emitter->whitespace = 0;
    emitter->indention = 0;

    return 1;
}